

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

Nf_Mat_t * Nf_ObjMatchBest(Nf_Man_t *p,int i,int c)

{
  Nf_Man_t *pNVar1;
  Nf_Mat_t *pA;
  Nf_Mat_t *pD;
  int c_local;
  int i_local;
  Nf_Man_t *p_local;
  
  pNVar1 = (Nf_Man_t *)Nf_ObjMatchD(p,i,c);
  p_local = (Nf_Man_t *)Nf_ObjMatchA(p,i,c);
  if (*(uint *)&pNVar1->pGia >> 0x1f == *(uint *)&p_local->pGia >> 0x1f) {
    __assert_fail("pD->fBest != pA->fBest",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x583,"Nf_Mat_t *Nf_ObjMatchBest(Nf_Man_t *, int, int)");
  }
  if ((-1 < *(int *)&p_local->pGia) && (p_local = pNVar1, -1 < *(int *)&pNVar1->pGia)) {
    p_local = (Nf_Man_t *)0x0;
  }
  return (Nf_Mat_t *)p_local;
}

Assistant:

static inline Nf_Mat_t * Nf_ObjMatchBest( Nf_Man_t * p, int i, int c )             
{
    Nf_Mat_t * pD = Nf_ObjMatchD(p, i, c);
    Nf_Mat_t * pA = Nf_ObjMatchA(p, i, c);
    assert( pD->fBest != pA->fBest );
    //assert( Nf_ObjMapRefNum(p, i, c) > 0 );
    if ( pA->fBest )
        return pA;
    if ( pD->fBest )
        return pD;
    return NULL;
}